

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBGetProgramResourceAPITest *this,GLuint test_case_index)

{
  GLchar *pGVar1;
  size_t sVar2;
  ulong uVar3;
  TestError *this_00;
  pointer ptVar4;
  stringstream stream;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar4 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case,_std::allocator<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case>_>
           ._M_impl.super__Vector_impl_data._M_start + test_case_index;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Stage: ",7);
  pGVar1 = Utils::Shader::GetStageName(ptVar4->m_stage);
  sVar2 = strlen(pGVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", type: ",8);
  pGVar1 = Utils::Type::GetGLSLTypeName(&ptVar4->m_type);
  if (pGVar1 == (GLchar *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(pGVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", case: ",8);
  uVar3 = (ulong)ptVar4->m_case;
  if (uVar3 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,&DAT_01a08e10 + *(int *)(&DAT_01a08e10 + uVar3 * 4),
               *(long *)(&DAT_01a08e20 + uVar3 * 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x578b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string XFBGetProgramResourceAPITest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	const test_Case&  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << ", type: " << test_case.m_type.GetGLSLTypeName() << ", case: ";

	switch (test_case.m_case)
	{
	case INTERLEAVED:
		stream << "interleaved";
		break;
	case SEPARATED:
		stream << "separated";
		break;
	case XFB:
		stream << "xfb";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}